

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O2

int fasttext::getArgGauss<int>
              (int val,minstd_rand *rng,double startSigma,double endSigma,double t,bool linear)

{
  undefined3 in_register_00000011;
  result_type_conflict __x;
  double dVar1;
  undefined1 in_register_00001208 [56];
  undefined1 auVar2 [64];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  normal_distribution<double> normal;
  normal_distribution<double> local_30;
  
  auVar2._8_56_ = in_register_00001208;
  auVar2._0_8_ = startSigma;
  local_30._M_param._M_mean = 0.0;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = t + -0.25;
  auVar4 = vmaxsd_avx(ZEXT816(0) << 0x40,auVar4);
  auVar4 = vminsd_avx(auVar4,ZEXT816(0x3fe0000000000000));
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (startSigma - endSigma) * -2.0;
  auVar4 = vfmadd213sd_fma(auVar3,auVar4,auVar2._0_16_);
  local_30._M_param._M_stddev = auVar4._0_8_;
  local_30._M_saved = 0.0;
  local_30._M_saved_available = false;
  __x = std::normal_distribution<double>::operator()(&local_30,rng);
  if (CONCAT31(in_register_00000011,linear) == 0) {
    dVar1 = exp2(__x);
    dVar1 = dVar1 * (double)val;
  }
  else {
    dVar1 = __x + (double)val;
  }
  return (int)dVar1;
}

Assistant:

T getArgGauss(
    T val,
    std::minstd_rand& rng,
    double startSigma,
    double endSigma,
    double t,
    bool linear) {
  T returnValue;
  const double stddev = startSigma -
      ((startSigma - endSigma) / 0.5) *
          std::min(0.5, std::max((t - 0.25), 0.0));

  std::normal_distribution<double> normal(0.0, stddev);

  const double coeff = normal(rng);
  double updateCoeff = 0.0;

  if (linear) {
    updateCoeff = coeff;
    returnValue = static_cast<T>(updateCoeff + val);
  } else {
    updateCoeff = std::pow(2.0, coeff);
    returnValue = static_cast<T>(updateCoeff * val);
  }

  return returnValue;
}